

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::transfer_conserve_refine
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2edges,LOs *keys2prods,
               LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  array<bool,_3UL> *this;
  OpConservation op_conservation_00;
  bool bVar1;
  reference pvVar2;
  Read<int> local_210;
  Read<int> local_200;
  undefined1 local_1ec [8];
  OpConservation op_conservation;
  Cavs local_1d0;
  undefined1 local_190 [8];
  CavsByBdryStatus cavs;
  Read<int> local_98;
  Read<int> local_88;
  undefined1 local_78 [8];
  Cavs init_cavs;
  LOs *prods2new_ents_local;
  LOs *keys2prods_local;
  LOs *keys2edges_local;
  Mesh *new_mesh_local;
  TransferOpts *opts_local;
  Mesh *old_mesh_local;
  
  init_cavs.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr = prods2new_ents;
  bVar1 = should_conserve_any(old_mesh,opts);
  if (bVar1) {
    Read<int>::Read(&local_88,keys2edges);
    Read<int>::Read(&local_98,keys2prods);
    Read<int>::Read((Read<int> *)
                    &cavs._M_elems[2]._M_elems[2].
                     super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,prods2new_ents);
    form_initial_cavs((Cavs *)local_78,old_mesh,new_mesh,1,&local_88,&local_98,
                      (LOs *)&cavs._M_elems[2]._M_elems[2].
                              super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    Read<int>::~Read((Read<int> *)
                     &cavs._M_elems[2]._M_elems[2].
                      super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    Read<int>::~Read(&local_98);
    Read<int>::~Read(&local_88);
    Cavs::Cavs(&local_1d0,(Cavs *)local_78);
    Read<int>::Read((Read<int> *)(op_conservation.density.always._M_elems + 1),keys2edges);
    separate_cavities((CavsByBdryStatus *)local_190,old_mesh,new_mesh,&local_1d0,1,
                      (LOs *)(op_conservation.density.always._M_elems + 1),(Graph *)0x0);
    Read<int>::~Read((Read<int> *)(op_conservation.density.always._M_elems + 1));
    Cavs::~Cavs(&local_1d0);
    OpConservation::OpConservation((OpConservation *)local_1ec);
    pvVar2 = std::array<bool,_3UL>::operator[]((array<bool,_3UL> *)local_1ec,0);
    *pvVar2 = true;
    pvVar2 = std::array<bool,_3UL>::operator[]((array<bool,_3UL> *)local_1ec,1);
    *pvVar2 = true;
    pvVar2 = std::array<bool,_3UL>::operator[]((array<bool,_3UL> *)local_1ec,2);
    *pvVar2 = true;
    this = (array<bool,_3UL> *)(local_1ec + 6);
    pvVar2 = std::array<bool,_3UL>::operator[](this,0);
    *pvVar2 = true;
    pvVar2 = std::array<bool,_3UL>::operator[](this,1);
    *pvVar2 = true;
    pvVar2 = std::array<bool,_3UL>::operator[](this,2);
    *pvVar2 = true;
    Read<int>::Read(&local_200,same_ents2old_ents);
    Read<int>::Read(&local_210,same_ents2new_ents);
    op_conservation_00.momentum.this_time._M_elems[2] =
         op_conservation.density.this_time._M_elems[0];
    op_conservation_00.momentum.always._M_elems[0] = op_conservation.density.this_time._M_elems[1];
    op_conservation_00.momentum.always._M_elems[1] = op_conservation.density.this_time._M_elems[2];
    op_conservation_00.momentum.always._M_elems[2] = op_conservation.density.always._M_elems[0];
    op_conservation_00.density.this_time._M_elems[0] = (bool)local_1ec[0];
    op_conservation_00.density.this_time._M_elems[1] = (bool)local_1ec[1];
    op_conservation_00.density.this_time._M_elems[2] = (bool)local_1ec[2];
    op_conservation_00.density.always._M_elems[0] = (bool)local_1ec[3];
    op_conservation_00.density.always._M_elems[1] = (bool)local_1ec[4];
    op_conservation_00.density.always._M_elems[2] = (bool)local_1ec[5];
    op_conservation_00.momentum.this_time._M_elems[0] = (bool)local_1ec[6];
    op_conservation_00.momentum.this_time._M_elems[1] = (bool)local_1ec[7];
    transfer_conservation_errors
              (old_mesh,opts,new_mesh,(CavsByBdryStatus *)local_190,&local_200,&local_210,
               op_conservation_00);
    Read<int>::~Read(&local_210);
    Read<int>::~Read(&local_200);
    std::array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
    ~array((array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
            *)local_190);
    Cavs::~Cavs((Cavs *)local_78);
  }
  return;
}

Assistant:

void transfer_conserve_refine(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, LOs keys2edges, LOs keys2prods, LOs prods2new_ents,
    LOs same_ents2old_ents, LOs same_ents2new_ents) {
  if (!should_conserve_any(old_mesh, opts)) return;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, EDGE, keys2edges, keys2prods, prods2new_ents);
  auto cavs =
      separate_cavities(old_mesh, new_mesh, init_cavs, EDGE, keys2edges);
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = true;
  op_conservation.momentum.this_time[NOT_BDRY] = true;
  op_conservation.momentum.this_time[TOUCH_BDRY] = true;
  op_conservation.momentum.this_time[KEY_BDRY] = true;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}